

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallExportGenerator::GenerateScriptConfigs
          (cmInstallExportGenerator *this,ostream *os,Indent indent)

{
  char *pcVar1;
  long *plVar2;
  _Rb_tree_header *p_Var3;
  pointer pbVar4;
  pointer pbVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  cmExportInstallFileGenerator *pcVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pbVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  Indent indent_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string config_file_example;
  string toInstallFile;
  string config_test;
  string installedFile;
  string installedDir;
  string cxx_module_dest;
  int local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  _Rb_tree_node_base *local_180;
  ulong local_178;
  string local_170;
  string local_150;
  string local_130;
  char *local_110;
  string *local_108;
  size_type local_100;
  pointer local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined8 local_d8;
  string local_d0;
  string local_98;
  string local_78;
  string *local_58;
  string local_50;
  
  cmScriptGenerator::GenerateScriptConfigs((cmScriptGenerator *)this,os,indent);
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar9 = (this->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  p_Var8 = *(_Base_ptr *)((long)&(pcVar9->ConfigImportFiles)._M_t + 0x18);
  p_Var6 = (_Base_ptr)((long)&(pcVar9->ConfigImportFiles)._M_t + 8);
  local_178 = (ulong)(uint)indent.Level;
  if (p_Var8 != p_Var6) {
    local_180 = (_Rb_tree_node_base *)CONCAT44(local_180._4_4_,indent.Level + 2);
    local_58 = &(this->super_cmInstallGenerator).Destination;
    do {
      uVar13 = local_178;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_198,(value_type *)(p_Var8 + 2));
      cmScriptGenerator::CreateConfigTest
                (&local_130,(cmScriptGenerator *)this,(string *)(p_Var8 + 1));
      if (0 < (int)uVar13) {
        uVar12 = uVar13 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar10 = (int)uVar12 - 1;
          uVar12 = (ulong)uVar10;
        } while (uVar10 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,local_58,cmInstallType_FILES,&local_198,false,
                 (this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
                 local_180._0_4_,(char *)0x0);
      if (0 < (int)uVar13) {
        uVar13 = uVar13 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar10 = (int)uVar13 - 1;
          uVar13 = (ulong)uVar10;
        } while (uVar10 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
      pbVar5 = local_198.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = local_198.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar15 = &(local_198.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar15 + -1))->_M_dataplus)._M_p;
          if (paVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar2) {
            operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
          }
          pbVar14 = (pointer)(paVar15 + 1);
          paVar15 = paVar15 + 2;
        } while (pbVar14 != pbVar5);
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != p_Var6);
  }
  uVar13 = local_178;
  local_130._M_string_length =
       (size_type)(this->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  local_130._M_dataplus._M_p =
       (pointer)(this->super_cmInstallGenerator).Destination._M_string_length;
  local_130.field_2._M_allocated_capacity = 0;
  pcVar1 = (char *)((long)&local_d0.field_2 + 8);
  local_d0._M_dataplus._M_p = (char *)0x0;
  local_d0._M_string_length = 1;
  local_d0.field_2._M_local_buf[8] = '/';
  local_130.field_2._8_8_ = 1;
  local_108 = (string *)0x0;
  local_f8 = (this->CxxModulesDirectory)._M_dataplus._M_p;
  local_100 = (this->CxxModulesDirectory)._M_string_length;
  local_f0 = 0;
  views._M_len = 3;
  views._M_array = (iterator)&local_130;
  local_110 = pcVar1;
  local_d0.field_2._M_allocated_capacity = (size_type)pcVar1;
  cmCatViews(&local_78,views);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  pcVar9 = (this->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  if ((*(_Base_ptr *)((long)&(pcVar9->ConfigCxxModuleFiles)._M_t + 0x18) !=
       (_Base_ptr)((long)&(pcVar9->ConfigCxxModuleFiles)._M_t + 8U)) &&
     (std::__cxx11::string::_M_assign((string *)&local_170), local_170._M_string_length != 0)) {
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_150,&local_78);
    local_130._M_dataplus._M_p = (pointer)0xd;
    local_130._M_string_length = 0x820b3e;
    local_130.field_2._M_allocated_capacity = 0;
    local_130.field_2._8_8_ = local_150._M_string_length;
    local_110 = local_150._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (char *)0x0;
    local_d0._M_string_length = 1;
    local_d0.field_2._M_local_buf[8] = '/';
    local_100 = 1;
    local_f0 = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&local_130;
    local_108 = &local_150;
    local_f8 = pcVar1;
    local_d0.field_2._M_allocated_capacity = (size_type)pcVar1;
    cmCatViews(&local_98,views_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)local_98._M_string_length;
    local_130._M_string_length = (size_type)local_98._M_dataplus._M_p;
    local_130.field_2._M_allocated_capacity = 0;
    local_130.field_2._8_8_ = 0xd;
    local_110 = "/cxx-modules-";
    local_108 = (string *)0x0;
    local_f8 = (this->ExportSet->Name)._M_dataplus._M_p;
    local_100 = (this->ExportSet->Name)._M_string_length;
    local_f0 = 0;
    local_e8 = 6;
    local_e0 = ".cmake";
    local_d8 = 0;
    views_01._M_len = 4;
    views_01._M_array = (iterator)&local_130;
    cmCatViews(&local_d0,views_01);
    cmsys::SystemTools::GetFilenamePath(&local_50,&local_170);
    local_130._M_dataplus._M_p = (pointer)local_50._M_string_length;
    local_130._M_string_length = (size_type)local_50._M_dataplus._M_p;
    local_130.field_2._8_8_ = 0xd;
    local_110 = "/cxx-modules-";
    local_108 = (string *)0x0;
    local_f8 = (this->ExportSet->Name)._M_dataplus._M_p;
    local_100 = (this->ExportSet->Name)._M_string_length;
    local_f0 = 0;
    local_e8 = 6;
    local_e0 = ".cmake";
    local_d8 = 0;
    views_02._M_len = 4;
    views_02._M_array = (iterator)&local_130;
    local_130.field_2._M_allocated_capacity = (size_type)&local_50;
    cmCatViews(&local_150,views_02);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    indent_00.Level = (int)uVar13;
    if (0 < indent_00.Level) {
      uVar12 = uVar13 & 0xffffffff;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        uVar10 = (int)uVar12 - 1;
        uVar12 = (ulong)uVar10;
      } while (uVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"if(EXISTS \"",0xb);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
    local_1a8 = indent_00.Level + 2;
    iVar11 = local_1a8;
    if (-2 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"file(DIFFERENT _cmake_export_file_changed FILES\n",0x30);
    iVar11 = local_1a8;
    if (-2 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"     \"",6);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
    iVar11 = local_1a8;
    if (-2 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"     \"",6);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
    iVar11 = local_1a8;
    if (-2 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"if(_cmake_export_file_changed)\n",0x1f);
    iVar18 = indent_00.Level + 4;
    iVar11 = iVar18;
    if (-4 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"file(GLOB _cmake_old_config_files \"",0x23);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_98._M_dataplus._M_p,local_98._M_string_length);
    cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_
              (&local_130,
               (this->EFGen)._M_t.
               super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
               .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_130._M_dataplus._M_p,local_130._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      (ulong)(local_130.field_2._M_allocated_capacity + 1));
    }
    iVar11 = iVar18;
    if (-4 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"if(_cmake_old_config_files)\n",0x1c);
    iVar17 = indent_00.Level + 6;
    iVar11 = iVar17;
    if (-6 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,
               "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n"
               ,0x53);
    iVar11 = iVar17;
    if (-6 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"message(STATUS \"Old C++ module export file \\\"",0x2d);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n",0x4a
              );
    iVar11 = iVar17;
    if (-6 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"unset(_cmake_old_config_files_text)\n",0x24);
    if (-6 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar17 = iVar17 + -1;
      } while (iVar17 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"file(REMOVE ${_cmake_old_config_files})\n",0x28);
    iVar11 = iVar18;
    if (-4 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
    if (-4 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"unset(_cmake_old_config_files)\n",0x1f);
    iVar11 = local_1a8;
    if (-2 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
    if (-2 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        local_1a8 = local_1a8 + -1;
      } while (local_1a8 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"unset(_cmake_export_file_changed)\n",0x22);
    if (0 < indent_00.Level) {
      uVar13 = uVar13 & 0xffffffff;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        uVar10 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar10;
      } while (uVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_198,&local_150);
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,&local_78,cmInstallType_FILES,&local_198,false,
               (this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
               indent_00,(char *)0x0);
    pbVar5 = local_198.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = local_198.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar15 = &(local_198.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar15 + -1))->_M_dataplus)._M_p;
        if (paVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar2) {
          operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
        }
        pbVar14 = (pointer)(paVar15 + 1);
        paVar15 = paVar15 + 2;
      } while (pbVar14 != pbVar5);
      local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    uVar13 = local_178;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,(ulong)(local_d0.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar9 = (this->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  p_Var8 = *(_Base_ptr *)((long)&(pcVar9->ConfigCxxModuleFiles)._M_t + 0x18);
  p_Var3 = (_Rb_tree_header *)((long)&(pcVar9->ConfigCxxModuleFiles)._M_t + 8);
  if ((_Rb_tree_header *)p_Var8 != p_Var3) {
    local_180 = (_Rb_tree_node_base *)CONCAT44(local_180._4_4_,(int)uVar13 + 2);
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_198,(value_type *)(p_Var8 + 2));
      cmScriptGenerator::CreateConfigTest
                (&local_130,(cmScriptGenerator *)this,(string *)(p_Var8 + 1));
      if (0 < (int)uVar13) {
        uVar12 = uVar13 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar10 = (int)uVar12 - 1;
          uVar12 = (ulong)uVar10;
        } while (uVar10 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&local_78,cmInstallType_FILES,&local_198,false,
                 (this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
                 local_180._0_4_,(char *)0x0);
      if (0 < (int)uVar13) {
        uVar13 = uVar13 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar10 = (int)uVar13 - 1;
          uVar13 = (ulong)uVar10;
        } while (uVar10 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
      pbVar5 = local_198.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = local_198.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar15 = &(local_198.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar15 + -1))->_M_dataplus)._M_p;
          if (paVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar2) {
            operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
          }
          pbVar14 = (pointer)(paVar15 + 1);
          paVar15 = paVar15 + 2;
        } while (pbVar14 != pbVar5);
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        (ulong)(local_130.field_2._M_allocated_capacity + 1));
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      uVar13 = local_178;
    } while ((_Rb_tree_header *)p_Var8 != p_Var3);
    pcVar9 = (this->EFGen)._M_t.
             super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
             .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  }
  p_Var8 = *(_Base_ptr *)((long)&(pcVar9->ConfigCxxModuleTargetFiles)._M_t._M_impl + 0x18);
  p_Var3 = (_Rb_tree_header *)((long)&(pcVar9->ConfigCxxModuleTargetFiles)._M_t._M_impl + 8);
  if ((_Rb_tree_header *)p_Var8 != p_Var3) {
    uVar12 = uVar13;
    local_180 = (_Rb_tree_node_base *)p_Var3;
    do {
      cmScriptGenerator::CreateConfigTest
                (&local_130,(cmScriptGenerator *)this,(string *)(p_Var8 + 1));
      if (0 < (int)uVar12) {
        uVar16 = uVar12 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar10 = (int)uVar16 - 1;
          uVar16 = (ulong)uVar10;
        } while (uVar10 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&local_78,cmInstallType_FILES,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(p_Var8 + 2),false,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
                 (char *)0x0,(char *)0x0,(Indent)((int)uVar13 + 2),(char *)0x0);
      if (0 < (int)uVar12) {
        uVar12 = uVar12 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar10 = (int)uVar12 - 1;
          uVar12 = (ulong)uVar10;
        } while (uVar10 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
      pbVar5 = local_198.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = local_198.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar15 = &(local_198.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar15 + -1))->_M_dataplus)._M_p;
          if (paVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar2) {
            operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
          }
          pbVar14 = (pointer)(paVar15 + 1);
          paVar15 = paVar15 + 2;
        } while (pbVar14 != pbVar5);
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        (ulong)(local_130.field_2._M_allocated_capacity + 1));
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      uVar12 = local_178;
    } while (p_Var8 != local_180);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptConfigs(std::ostream& os,
                                                     Indent indent)
{
  // Create the main install rules first.
  this->cmInstallGenerator::GenerateScriptConfigs(os, indent);

  // Now create a configuration-specific install rule for the import
  // file of each configuration.
  std::vector<std::string> files;
  for (auto const& i : this->EFGen->GetConfigImportFiles()) {
    files.push_back(i.second);
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, this->Destination, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }

  // Now create a configuration-specific install rule for the C++ module import
  // property file of each configuration.
  auto cxx_module_dest =
    cmStrCat(this->Destination, '/', this->CxxModulesDirectory);
  std::string config_file_example;
  for (auto const& i : this->EFGen->GetConfigCxxModuleFiles()) {
    config_file_example = i.second;
    break;
  }
  if (!config_file_example.empty()) {
    // Remove old per-configuration export files if the main changes.
    std::string installedDir = cmStrCat(
      "$ENV{DESTDIR}", ConvertToAbsoluteDestination(cxx_module_dest), '/');
    std::string installedFile = cmStrCat(installedDir, "/cxx-modules-",
                                         this->ExportSet->GetName(), ".cmake");
    std::string toInstallFile =
      cmStrCat(cmSystemTools::GetFilenamePath(config_file_example),
               "/cxx-modules-", this->ExportSet->GetName(), ".cmake");
    os << indent << "if(EXISTS \"" << installedFile << "\")\n";
    Indent indentN = indent.Next();
    Indent indentNN = indentN.Next();
    Indent indentNNN = indentNN.Next();
    /* clang-format off */
    os << indentN << "file(DIFFERENT _cmake_export_file_changed FILES\n"
       << indentN << "     \"" << installedFile << "\"\n"
       << indentN << "     \"" << toInstallFile << "\")\n";
    os << indentN << "if(_cmake_export_file_changed)\n";
    os << indentNN << "file(GLOB _cmake_old_config_files \"" << installedDir
       << this->EFGen->GetConfigImportFileGlob() << "\")\n";
    os << indentNN << "if(_cmake_old_config_files)\n";
    os << indentNNN << "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n";
    os << indentNNN << R"(message(STATUS "Old C++ module export file \")" << installedFile
       << "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n";
    os << indentNNN << "unset(_cmake_old_config_files_text)\n";
    os << indentNNN << "file(REMOVE ${_cmake_old_config_files})\n";
    os << indentNN << "endif()\n";
    os << indentNN << "unset(_cmake_old_config_files)\n";
    os << indentN << "endif()\n";
    os << indentN << "unset(_cmake_export_file_changed)\n";
    os << indent << "endif()\n";
    /* clang-format on */

    // All of these files are siblings; get its location to know where the
    // "anchor" file is.
    files.push_back(toInstallFile);
    this->AddInstallRule(os, cxx_module_dest, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent);
    files.clear();
  }
  for (auto const& i : this->EFGen->GetConfigCxxModuleFiles()) {
    files.push_back(i.second);
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, cxx_module_dest, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }
  for (auto const& i : this->EFGen->GetConfigCxxModuleTargetFiles()) {
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, cxx_module_dest, cmInstallType_FILES, i.second,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }
}